

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

void __thiscall TypeInfo::inform_symbol(TypeInfo *this,string *name,TypeSpec *type)

{
  TypeSpec *in_RDX;
  GoalSymbol *in_RSI;
  TypeSpec *in_RDI;
  string *in_stack_00000028;
  TypeInfo *in_stack_00000030;
  TypeSpec *in_stack_ffffffffffffff78;
  
  inform_symbol_with_no_type_info(in_stack_00000030,in_stack_00000028);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>_>
        *)in_RDI,&in_stack_ffffffffffffff78->m_base_type);
  TypeSpec::TypeSpec(in_RDI,in_stack_ffffffffffffff78);
  GoalSymbol::set_type(in_RSI,in_RDX);
  TypeSpec::~TypeSpec(in_RDI);
  return;
}

Assistant:

void TypeInfo::inform_symbol(const std::string &name, TypeSpec type) {
  inform_symbol_with_no_type_info(name);
  m_symbols.at(name).set_type(std::move(type));
}